

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O1

uint64_t default_read_func(exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,
                          uint64_t offset,exr_stream_error_func_ptr_t error_cb)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t __nbytes;
  
  if (userdata == (void *)0x0) {
    if (error_cb == (exr_stream_error_func_ptr_t)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar3 = "Invalid file handle pointer";
  }
  else {
    __fd = *userdata;
    if (-1 < __fd) {
      uVar4 = 0;
      __nbytes = sz;
      do {
        sVar1 = pread(__fd,buffer,__nbytes,offset);
        if (sVar1 < 0) {
          piVar2 = __errno_location();
          if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
            uVar4 = 0xffffffffffffffff;
            goto LAB_0011503a;
          }
        }
        else {
          if (sVar1 == 0) goto LAB_0011503a;
          uVar4 = uVar4 + sVar1;
          buffer = (void *)((long)buffer + sVar1);
          __nbytes = __nbytes - sVar1;
          offset = offset + sVar1;
        }
        if ((long)sz <= (long)uVar4) {
LAB_0011503a:
          if (error_cb == (exr_stream_error_func_ptr_t)0x0) {
            return uVar4;
          }
          if (-1 < (long)uVar4) {
            return uVar4;
          }
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          (*error_cb)(ctxt,10,"Unable to read %lu bytes: %s",sz,pcVar3);
          return uVar4;
        }
      } while( true );
    }
    if (error_cb == (exr_stream_error_func_ptr_t)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar3 = "Invalid file descriptor";
  }
  (*error_cb)(ctxt,3,pcVar3);
  return 0xffffffffffffffff;
}

Assistant:

static uint64_t
default_read_func (
    exr_const_context_t         ctxt,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    int64_t                          rv, retsz = -1;
    struct _internal_exr_filehandle* fh     = (struct _internal_exr_filehandle*) userdata;
    int                              fd     = -1;
    char*                            curbuf = (char*) buffer;
    uint64_t                         readsz = sz;

    if (sizeof (size_t) == 4)
    {
        if (sz >= (uint64_t) UINT32_MAX)
        {
            if (error_cb)
                error_cb (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "read request size too large for architecture");
            return retsz;
        }
    }

    if (!fh)
    {
        if (error_cb)
            error_cb (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file handle pointer");
        return retsz;
    }

    fd = fh->fd;
    if (fd < 0)
    {
        if (error_cb)
            error_cb (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file descriptor");
        return retsz;
    }

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    pthread_mutex_lock (&(fh->mutex));
#    endif
    {
#    if defined __USE_LARGEFILE64
        uint64_t spos = (uint64_t) lseek64 (fd, (off64_t) offset, SEEK_SET);
#    else
        uint64_t spos = (uint64_t) lseek (fd, (off_t) offset, SEEK_SET);
#    endif
        if (spos != offset)
        {
#    ifdef ILMTHREAD_THREADING_ENABLED
            pthread_mutex_unlock (&(fh->mutex));
#    endif
            if (error_cb)
            {
                if (spos == (uint64_t) -1)
                    error_cb (ctxt, EXR_ERR_READ_IO, strerror (errno));
                else
                    error_cb (
                        ctxt,
                        EXR_ERR_READ_IO,
                        "Unable to seek to requested position");
            }
            return retsz;
        }
    }
#endif

    retsz = 0;
    do
    {
#if CAN_USE_PREAD
        rv = pread (fd, curbuf, (size_t) readsz, (off_t) offset);
#else
        rv = read (fd, curbuf, (size_t) readsz);
#endif
        if (rv < 0)
        {
            if (errno == EINTR) continue;
            if (errno == EAGAIN) continue;
            retsz = -1;
            break;
        }
        if (rv == 0) break;
        retsz += rv;
        curbuf += rv;
        readsz -= (uint64_t) rv;
        offset += (uint64_t) rv;
    } while (retsz < (int64_t) sz);

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    pthread_mutex_unlock (&(fh->mutex));
#    endif
#endif
    if (retsz < 0 && error_cb)
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to read %" PRIu64 " bytes: %s",
            sz,
            strerror (errno));
    return retsz;
}